

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O0

void __thiscall
ON_RenderChannels::GetCustomList(ON_RenderChannels *this,ON_SimpleArray<ON_UUID_struct> *chan)

{
  ON_InternalXMLImpl *this_00;
  int iVar1;
  wchar_t *pwVar2;
  ON_UUID OVar3;
  ON_wString local_248;
  ON_wString local_240;
  undefined1 local_238 [8];
  ON_UUID uuid;
  int pos;
  int len;
  ON_XMLVariant local_210;
  ON_XMLVariant local_118;
  undefined1 local_20 [8];
  ON_wString s;
  ON_SimpleArray<ON_UUID_struct> *chan_local;
  ON_RenderChannels *this_local;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  s.m_s = (wchar_t *)chan;
  pwVar2 = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_210,false);
  ON_InternalXMLImpl::GetParameter(&local_118,this_00,pwVar2,L"list",&local_210);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)local_20);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_210);
  iVar1 = ON_wString::Length((ON_wString *)local_20);
  if (iVar1 == 0) {
    uuid.Data4[4] = '\x01';
    uuid.Data4[5] = '\0';
    uuid.Data4[6] = '\0';
    uuid.Data4[7] = '\0';
  }
  else {
    pwVar2 = ON_wString::operator[]((ON_wString *)local_20,iVar1 + -1);
    if (*pwVar2 != L';') {
      ON_wString::operator+=((ON_wString *)local_20,L';');
    }
    uuid.Data4[0] = 0xff;
    uuid.Data4[1] = 0xff;
    uuid.Data4[2] = 0xff;
    uuid.Data4[3] = 0xff;
    while( true ) {
      uuid.Data4._0_4_ = ON_wString::Find((ON_wString *)local_20,L";");
      if ((int)uuid.Data4._0_4_ < 0) break;
      ON_wString::Left(&local_240,(int)local_20);
      pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_240);
      OVar3 = ON_UuidFromString(pwVar2);
      uuid._0_8_ = OVar3.Data4;
      local_238 = OVar3._0_8_;
      ON_wString::~ON_wString(&local_240);
      ON_SimpleArray<ON_UUID_struct>::Append
                ((ON_SimpleArray<ON_UUID_struct> *)s.m_s,(ON_UUID_struct *)local_238);
      ON_wString::Mid(&local_248,(int)local_20);
      ON_wString::operator=((ON_wString *)local_20,&local_248);
      ON_wString::~ON_wString(&local_248);
    }
    uuid.Data4[4] = '\0';
    uuid.Data4[5] = '\0';
    uuid.Data4[6] = '\0';
    uuid.Data4[7] = '\0';
  }
  ON_wString::~ON_wString((ON_wString *)local_20);
  return;
}

Assistant:

void ON_RenderChannels::GetCustomList(ON_SimpleArray<ON_UUID>& chan) const
{
  ON_wString s = m_impl->GetParameter(XMLPath(), ON_RDK_RCH_LIST, false).AsString();
  const int len = s.Length();
  if (len == 0)
    return;

  if (s[len-1] != L';')
    s += L';';

  int pos = -1;
  while ((pos = s.Find(L";")) >= 0)
  {
    const ON_UUID uuid = ON_UuidFromString(s.Left(pos));
    chan.Append(uuid);
    s = s.Mid(pos+1);
  }
}